

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::Schema> * __thiscall
kj::ArrayBuilder<capnp::Schema>::operator=
          (ArrayBuilder<capnp::Schema> *this,ArrayBuilder<capnp::Schema> *other)

{
  ArrayBuilder<capnp::Schema> *other_local;
  ArrayBuilder<capnp::Schema> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Schema *)0x0;
  other->pos = (RemoveConst<capnp::Schema> *)0x0;
  other->endPtr = (Schema *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }